

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool re2::ChildArgsChanged(Regexp *re,Regexp **child_args)

{
  int iVar1;
  Regexp **ppRVar2;
  Regexp *newsub_1;
  int i_1;
  Regexp *newsub;
  Regexp *sub;
  int i;
  Regexp **child_args_local;
  Regexp *re_local;
  
  sub._4_4_ = 0;
  while( true ) {
    iVar1 = Regexp::nsub(re);
    if (iVar1 <= sub._4_4_) {
      for (newsub_1._4_4_ = 0; iVar1 = Regexp::nsub(re), newsub_1._4_4_ < iVar1;
          newsub_1._4_4_ = newsub_1._4_4_ + 1) {
        Regexp::Decref(child_args[newsub_1._4_4_]);
      }
      return false;
    }
    ppRVar2 = Regexp::sub(re);
    if (child_args[sub._4_4_] != ppRVar2[sub._4_4_]) break;
    sub._4_4_ = sub._4_4_ + 1;
  }
  return true;
}

Assistant:

static bool ChildArgsChanged(Regexp* re, Regexp** child_args) {
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* sub = re->sub()[i];
    Regexp* newsub = child_args[i];
    if (newsub != sub)
      return true;
  }
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* newsub = child_args[i];
    newsub->Decref();
  }
  return false;
}